

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_common.c
# Opt level: O2

LY_ERR lysp_check_dup_features(lysp_ctx *ctx,lysp_module *mod)

{
  LY_ERR LVar1;
  ly_ht *ht;
  lysp_feature *plVar2;
  lysp_include *plVar3;
  ulong uVar4;
  ulong uVar5;
  lysp_feature *plVar6;
  lysp_feature *plVar7;
  
  LVar1 = LY_EMEM;
  ht = lyht_new(8,8,ly_ptrequal_cb,(void *)0x0,1);
  if (ht != (ly_ht *)0x0) {
    plVar2 = mod->features;
    plVar6 = plVar2;
    for (plVar7 = plVar2;
        (plVar2 != (lysp_feature *)0x0 &&
        ((ulong)((long)plVar7 - (long)plVar2) >> 6 < *(ulong *)&plVar2[-1].flags));
        plVar7 = plVar7 + 1) {
      LVar1 = lysp_check_dup_ht_insert
                        (ctx,ht,plVar6->name,"feature",
                         "name collision with another top-level feature");
      if (LVar1 != LY_SUCCESS) goto LAB_0015c643;
      plVar6 = plVar6 + 1;
      plVar2 = mod->features;
    }
    plVar3 = mod->includes;
    uVar5 = 0;
    while( true ) {
      if (plVar3 == (lysp_include *)0x0) {
        uVar4 = 0;
      }
      else {
        uVar4 = *(ulong *)(plVar3[-1].rev + 8);
      }
      if (uVar4 <= uVar5) break;
      plVar2 = (plVar3[uVar5].submodule)->features;
      plVar6 = plVar2;
      while( true ) {
        plVar3 = mod->includes;
        plVar7 = (plVar3[uVar5].submodule)->features;
        if ((plVar7 == (lysp_feature *)0x0) ||
           (*(ulong *)&plVar7[-1].flags <= (ulong)((long)plVar6 - (long)plVar7) >> 6)) break;
        LVar1 = lysp_check_dup_ht_insert
                          (ctx,ht,plVar2->name,"feature",
                           "name collision with another top-level feature");
        plVar2 = plVar2 + 1;
        plVar6 = plVar6 + 1;
        if (LVar1 != LY_SUCCESS) goto LAB_0015c643;
      }
      uVar5 = uVar5 + 1;
    }
    LVar1 = LY_SUCCESS;
LAB_0015c643:
    lyht_free(ht,(_func_void_void_ptr *)0x0);
  }
  return LVar1;
}

Assistant:

LY_ERR
lysp_check_dup_features(struct lysp_ctx *ctx, struct lysp_module *mod)
{
    LY_ARRAY_COUNT_TYPE u;
    struct ly_ht *ht;
    struct lysp_feature *f;
    LY_ERR ret = LY_SUCCESS;

    ht = lyht_new(LYHT_MIN_SIZE, sizeof(void *), ly_ptrequal_cb, NULL, 1);
    LY_CHECK_RET(!ht, LY_EMEM);

    /* add all module features into a hash table */
    LY_ARRAY_FOR(mod->features, struct lysp_feature, f) {
        ret = lysp_check_dup_ht_insert(ctx, ht, f->name, "feature",
                "name collision with another top-level feature");
        LY_CHECK_GOTO(ret, cleanup);
    }

    /* add all submodule features into a hash table */
    LY_ARRAY_FOR(mod->includes, u) {
        LY_ARRAY_FOR(mod->includes[u].submodule->features, struct lysp_feature, f) {
            ret = lysp_check_dup_ht_insert(ctx, ht, f->name, "feature",
                    "name collision with another top-level feature");
            LY_CHECK_GOTO(ret, cleanup);
        }
    }

cleanup:
    lyht_free(ht, NULL);
    return ret;
}